

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_default_str_add_fail2(void)

{
  int iVar1;
  char *local_30;
  char *s1;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&s1,0,"program");
  if (iVar1 == 0) {
    local_30 = "abc";
    cargo._4_4_ = cargo_add_option((cargo_t)s1,CARGO_OPT_DEFAULT_LITERAL,"--alpha -a","an option",
                                   "s",&local_30);
    if (cargo._4_4_ == 0) {
      pcStack_18 = "Expected to fail";
    }
    cargo_destroy((cargo_t *)&s1);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_default_str_add_fail2)
{
    char *s1 = "abc";
    cargo_assert(s1, "Failed to allocate");

    // This should fail sinc CARGO_AUTOCLEAN is not on.
    ret = cargo_add_option(cargo, CARGO_OPT_DEFAULT_LITERAL,
            "--alpha -a", "an option", "s", &s1);
    cargo_assert(ret != 0, "Expected to fail");

    _TEST_CLEANUP();
}